

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall testing::internal::UnitTestImpl::failed_test_count(UnitTestImpl *this)

{
  int iVar1;
  UnitTestImpl *this_local;
  
  iVar1 = SumOverTestCaseList((internal *)&this->test_cases_,
                              (vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                              TestCase::failed_test_count,0);
  return iVar1;
}

Assistant:

int UnitTestImpl::failed_test_count() const {
  return SumOverTestCaseList(test_cases_, &TestCase::failed_test_count);
}